

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void __thiscall cmELF::cmELF(cmELF *this,char *fname)

{
  bool bVar1;
  byte bVar2;
  type pbVar3;
  pointer pbVar4;
  long *plVar5;
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  local_80;
  unique_ptr<cmELFInternalImpl<cmELFTypes64>,_std::default_delete<cmELFInternalImpl<cmELFTypes64>_>_>
  local_78;
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  local_70;
  unique_ptr<cmELFInternalImpl<cmELFTypes32>,_std::default_delete<cmELFInternalImpl<cmELFTypes32>_>_>
  local_68;
  undefined4 local_5c;
  undefined1 auStack_58 [4];
  ByteOrderType order;
  __mbstate_t local_50;
  char local_48;
  char local_47;
  char local_46;
  char local_45;
  char local_44;
  char local_43;
  char ident [16];
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  local_20;
  __single_object fin;
  char *fname_local;
  cmELF *this_local;
  
  fin._M_t.
  super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
          )fname;
  std::unique_ptr<cmELFInternal,std::default_delete<cmELFInternal>>::
  unique_ptr<std::default_delete<cmELFInternal>,void>
            ((unique_ptr<cmELFInternal,std::default_delete<cmELFInternal>> *)this);
  std::__cxx11::string::string((string *)&this->ErrorMessage);
  std::make_unique<std::ifstream,char_const*&,std::_Ios_Openmode_const&>
            ((char **)&local_20,(_Ios_Openmode *)&fin);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (bVar1) {
    pbVar3 = std::
             unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             ::operator*(&local_20);
    bVar2 = std::ios::operator!((ios *)(pbVar3 + *(long *)(*(long *)pbVar3 + -0x18)));
    if ((bVar2 & 1) == 0) {
      pbVar4 = std::
               unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
               ::operator->(&local_20);
      plVar5 = (long *)std::istream::read((char *)pbVar4,(long)&local_48);
      bVar2 = std::ios::operator!((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if ((bVar2 & 1) == 0) {
        pbVar4 = std::
                 unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                 ::operator->(&local_20);
        std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_58,0);
        plVar5 = (long *)std::istream::seekg(pbVar4,_auStack_58,local_50);
        bVar2 = std::ios::operator!((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
        if ((bVar2 & 1) == 0) {
          if ((((local_48 == '\x7f') && (local_47 == 'E')) && (local_46 == 'L')) &&
             (local_45 == 'F')) {
            if (local_43 == '\x01') {
              local_5c = 1;
            }
            else {
              if (local_43 != '\x02') {
                std::__cxx11::string::operator=
                          ((string *)&this->ErrorMessage,"ELF file is not LSB or MSB encoded.");
                goto LAB_00147aea;
              }
              local_5c = 0;
            }
            if (local_44 == '\x01') {
              local_70._M_t.
              super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
              _M_head_impl = (__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                              )(__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                                )this;
              std::
              make_unique<cmELFInternalImpl<cmELFTypes32>,cmELF*,std::unique_ptr<std::ifstream,std::default_delete<std::ifstream>>,cmELFInternal::ByteOrderType&>
                        ((cmELF **)&local_68,&local_70,(ByteOrderType *)&local_20);
              std::unique_ptr<cmELFInternal,std::default_delete<cmELFInternal>>::operator=
                        ((unique_ptr<cmELFInternal,std::default_delete<cmELFInternal>> *)this,
                         &local_68);
              std::
              unique_ptr<cmELFInternalImpl<cmELFTypes32>,_std::default_delete<cmELFInternalImpl<cmELFTypes32>_>_>
              ::~unique_ptr(&local_68);
            }
            else if (local_44 == '\x02') {
              local_80._M_t.
              super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
              _M_head_impl = (__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                              )(__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
                                )this;
              std::
              make_unique<cmELFInternalImpl<cmELFTypes64>,cmELF*,std::unique_ptr<std::ifstream,std::default_delete<std::ifstream>>,cmELFInternal::ByteOrderType&>
                        ((cmELF **)&local_78,&local_80,(ByteOrderType *)&local_20);
              std::unique_ptr<cmELFInternal,std::default_delete<cmELFInternal>>::operator=
                        ((unique_ptr<cmELFInternal,std::default_delete<cmELFInternal>> *)this,
                         &local_78);
              std::
              unique_ptr<cmELFInternalImpl<cmELFTypes64>,_std::default_delete<cmELFInternalImpl<cmELFTypes64>_>_>
              ::~unique_ptr(&local_78);
            }
            else {
              std::__cxx11::string::operator=
                        ((string *)&this->ErrorMessage,"ELF file class is not 32-bit or 64-bit.");
            }
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)&this->ErrorMessage,
                       "File does not have a valid ELF identification.");
          }
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)&this->ErrorMessage,"Error seeking to beginning of file.");
        }
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)&this->ErrorMessage,"Error reading ELF identification.");
      }
      goto LAB_00147aea;
    }
  }
  std::__cxx11::string::operator=((string *)&this->ErrorMessage,"Error opening input file.");
LAB_00147aea:
  std::
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

cmELF::cmELF(const char* fname)
{
  // Try to open the file.
  auto fin = cm::make_unique<cmsys::ifstream>(fname, std::ios::binary);

  // Quit now if the file could not be opened.
  if (!fin || !*fin) {
    this->ErrorMessage = "Error opening input file.";
    return;
  }

  // Read the ELF identification block.
  char ident[EI_NIDENT];
  if (!fin->read(ident, EI_NIDENT)) {
    this->ErrorMessage = "Error reading ELF identification.";
    return;
  }
  if (!fin->seekg(0)) {
    this->ErrorMessage = "Error seeking to beginning of file.";
    return;
  }

  // Verify the ELF identification.
  if (!(ident[EI_MAG0] == ELFMAG0 && ident[EI_MAG1] == ELFMAG1 &&
        ident[EI_MAG2] == ELFMAG2 && ident[EI_MAG3] == ELFMAG3)) {
    this->ErrorMessage = "File does not have a valid ELF identification.";
    return;
  }

  // Check the byte order in which the rest of the file is encoded.
  cmELFInternal::ByteOrderType order;
  if (ident[EI_DATA] == ELFDATA2LSB) {
    // File is LSB.
    order = cmELFInternal::ByteOrderLSB;
  } else if (ident[EI_DATA] == ELFDATA2MSB) {
    // File is MSB.
    order = cmELFInternal::ByteOrderMSB;
  } else {
    this->ErrorMessage = "ELF file is not LSB or MSB encoded.";
    return;
  }

  // Check the class of the file and construct the corresponding
  // parser implementation.
  if (ident[EI_CLASS] == ELFCLASS32) {
    // 32-bit ELF
    this->Internal = cm::make_unique<cmELFInternalImpl<cmELFTypes32>>(
      this, std::move(fin), order);
  } else if (ident[EI_CLASS] == ELFCLASS64) {
    // 64-bit ELF
    this->Internal = cm::make_unique<cmELFInternalImpl<cmELFTypes64>>(
      this, std::move(fin), order);
  } else {
    this->ErrorMessage = "ELF file class is not 32-bit or 64-bit.";
    return;
  }
}